

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clipper.cpp
# Opt level: O2

void ClipperLib::InitEdge(TEdge *e,TEdge *eNext,TEdge *ePrev,IntPoint *pt,PolyType polyType)

{
  long64 lVar1;
  long lVar2;
  int iVar3;
  long lStack_30;
  
  memset(e,0,0x90);
  e->next = eNext;
  e->prev = ePrev;
  lVar1 = pt->X;
  e->xcurr = lVar1;
  lVar2 = pt->Y;
  e->ycurr = lVar2;
  if (lVar2 < eNext->ycurr) {
    e->xtop = lVar1;
    e->ytop = lVar2;
    e->xbot = eNext->xcurr;
    iVar3 = -1;
    lStack_30 = 8;
  }
  else {
    e->xbot = lVar1;
    e->ybot = lVar2;
    e->xtop = eNext->xcurr;
    iVar3 = 1;
    lStack_30 = 0x28;
  }
  *(long64 *)((long)&e->xbot + lStack_30) = eNext->ycurr;
  e->windDelta = iVar3;
  SetDx(e);
  e->polyType = polyType;
  e->outIdx = -1;
  return;
}

Assistant:

void InitEdge(TEdge *e, TEdge *eNext,
  TEdge *ePrev, const IntPoint &pt, PolyType polyType)
{
  std::memset( e, 0, sizeof( TEdge ));

  e->next = eNext;
  e->prev = ePrev;
  e->xcurr = pt.X;
  e->ycurr = pt.Y;
  if (e->ycurr >= e->next->ycurr)
  {
    e->xbot = e->xcurr;
    e->ybot = e->ycurr;
    e->xtop = e->next->xcurr;
    e->ytop = e->next->ycurr;
    e->windDelta = 1;
  } else
  {
    e->xtop = e->xcurr;
    e->ytop = e->ycurr;
    e->xbot = e->next->xcurr;
    e->ybot = e->next->ycurr;
    e->windDelta = -1;
  }
  SetDx(*e);
  e->polyType = polyType;
  e->outIdx = -1;
}